

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O1

void __thiscall FfsParser::outputInfo(FfsParser *this)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
  fitTable;
  CBString secInfo;
  vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
  messages;
  vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
  local_80;
  FfsParser *local_68;
  CBString local_60;
  vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
  local_48;
  
  getMessages(&local_48,this);
  if (local_48.
      super__Vector_base<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar3 = 0x10;
    uVar4 = 0;
    do {
      pcVar1 = *(char **)((long)&((local_48.
                                   super__Vector_base<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->first)._vptr_CBString
                         + lVar3);
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1ad2b0);
      }
      else {
        sVar2 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x30;
    } while (uVar4 < (ulong)(((long)local_48.
                                    super__Vector_base<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_48.
                                    super__Vector_base<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            -0x5555555555555555));
  }
  local_68 = this;
  std::
  vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
  ::vector(&local_80,&this->fitParser->fitTable);
  if (local_80.
      super__Vector_base<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_80.
      super__Vector_base<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "---------------------------------------------------------------------------",0x4b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "     Address      |   Size    |  Ver  | CS  |          Type / Info          ",0x4c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "---------------------------------------------------------------------------",0x4b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    if (local_80.
        super__Vector_base<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_80.
        super__Vector_base<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        pcVar1 = *(char **)(*(long *)((long)&((local_80.
                                               super__Vector_base<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first).
                                             super__Vector_base<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar3) +
                           0x10);
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1ad2b0);
        }
        else {
          sVar2 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
        pcVar1 = *(char **)(*(long *)((long)&((local_80.
                                               super__Vector_base<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first).
                                             super__Vector_base<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar3) +
                           0x28);
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1ad2b0);
        }
        else {
          sVar2 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
        pcVar1 = *(char **)(*(long *)((long)&((local_80.
                                               super__Vector_base<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first).
                                             super__Vector_base<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar3) +
                           0x40);
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1ad2b0);
        }
        else {
          sVar2 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
        pcVar1 = *(char **)(*(long *)((long)&((local_80.
                                               super__Vector_base<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first).
                                             super__Vector_base<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar3) +
                           0x58);
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1ad2b0);
        }
        else {
          sVar2 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
        pcVar1 = *(char **)(*(long *)((long)&((local_80.
                                               super__Vector_base<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first).
                                             super__Vector_base<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar3) +
                           0x70);
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1ad2b0);
        }
        else {
          sVar2 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
        pcVar1 = *(char **)(*(long *)((long)&((local_80.
                                               super__Vector_base<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first).
                                             super__Vector_base<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar3) +
                           0x88);
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1ad2b0);
        }
        else {
          sVar2 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        std::ostream::flush();
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x30;
      } while (uVar4 < (ulong)(((long)local_80.
                                      super__Vector_base<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_80.
                                      super__Vector_base<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4) *
                              -0x5555555555555555));
    }
  }
  getSecurityInfo(&local_60,local_68);
  if (local_60.super_tagbstring.slen != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "---------------------------------------------------------------------------",0x4b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Security Info",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "---------------------------------------------------------------------------",0x4b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
    if (local_60.super_tagbstring.data == (uchar *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1ad2b0);
    }
    else {
      sVar2 = strlen((char *)local_60.super_tagbstring.data);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_60.super_tagbstring.data,sVar2);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  Bstrlib::CBString::~CBString(&local_60);
  std::
  vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
  ::~vector(&local_80);
  std::
  vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void FfsParser::outputInfo(void) {
    // Show ffsParser's messages
    std::vector<std::pair<UString, UModelIndex> > messages = getMessages();
    for (size_t i = 0; i < messages.size(); i++) {
        std::cout << (const char *)messages[i].first.toLocal8Bit() << std::endl;
    }
    
    // Get last VTF
    std::vector<std::pair<std::vector<UString>, UModelIndex > > fitTable = getFitTable();
    if (fitTable.size()) {
        std::cout << "---------------------------------------------------------------------------" << std::endl;
        std::cout << "     Address      |   Size    |  Ver  | CS  |          Type / Info          " << std::endl;
        std::cout << "---------------------------------------------------------------------------" << std::endl;
        for (size_t i = 0; i < fitTable.size(); i++) {
            std::cout
            << (const char *)fitTable[i].first[0].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[1].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[2].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[3].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[4].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[5].toLocal8Bit() << std::endl;
        }
    }
    
    // Get security info
    UString secInfo = getSecurityInfo();
    if (!secInfo.isEmpty()) {
        std::cout << "---------------------------------------------------------------------------"  << std::endl;
        std::cout << "Security Info" << std::endl;
        std::cout << "---------------------------------------------------------------------------"  << std::endl;
        std::cout << (const char *)secInfo.toLocal8Bit() << std::endl;
    }
}